

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool __thiscall spirv_cross::CompilerGLSL::should_dereference(CompilerGLSL *this,uint32_t id)

{
  Variant *pVVar1;
  ulong uVar2;
  bool bVar3;
  SPIRType *pSVar4;
  SPIRVariable *pSVar5;
  SPIRExpression *pSVar6;
  
  uVar2 = (ulong)id;
  pSVar4 = Compiler::expression_type(&this->super_Compiler,id);
  if ((pSVar4->pointer != true) ||
     (bVar3 = Compiler::expression_is_lvalue(&this->super_Compiler,id), !bVar3)) {
    return false;
  }
  if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size <= uVar2) {
    return true;
  }
  pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
  if (pVVar1[uVar2].type == TypeVariable) {
    pSVar5 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar2);
    return pSVar5->phi_variable;
  }
  pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
  if (pVVar1[uVar2].type != TypeExpression) {
    return true;
  }
  pSVar6 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar2);
  return (bool)(pSVar6->access_chain ^ 1);
}

Assistant:

bool CompilerGLSL::should_dereference(uint32_t id)
{
	const auto &type = expression_type(id);
	// Non-pointer expressions don't need to be dereferenced.
	if (!type.pointer)
		return false;

	// Handles shouldn't be dereferenced either.
	if (!expression_is_lvalue(id))
		return false;

	// If id is a variable but not a phi variable, we should not dereference it.
	if (auto *var = maybe_get<SPIRVariable>(id))
		return var->phi_variable;

	// If id is an access chain, we should not dereference it.
	if (auto *expr = maybe_get<SPIRExpression>(id))
		return !expr->access_chain;

	// Otherwise, we should dereference this pointer expression.
	return true;
}